

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool mjs::is_directive(expression *e)

{
  int iVar1;
  token_type tVar2;
  token *this;
  literal_expression *le;
  expression *e_local;
  
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])();
  if (iVar1 == 2) {
    this = literal_expression::t((literal_expression *)e);
    tVar2 = token::type(this);
    if (tVar2 == string_literal) {
      e_local._7_1_ = true;
    }
    else {
      e_local._7_1_ = false;
    }
  }
  else {
    e_local._7_1_ = false;
  }
  return e_local._7_1_;
}

Assistant:

bool is_directive(const expression& e) {
    if (e.type() != expression_type::literal) {
        return false;
    }
    const auto& le = static_cast<const literal_expression&>(e);
    if (le.t().type() != token_type::string_literal) {
        return false;
    }
    return true;
}